

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_float_2_suite::test_one(void)

{
  moment<float,_2> filter;
  size_type local_68;
  uint local_5c;
  basic_moment<float,_2UL,_(trial::online::with)1> local_58;
  
  local_58.member.window.super_span<float,_2UL>.member.data = (pointer)&local_58;
  local_58.member.window.super_span<float,_2UL>.member.size = 0;
  local_58.member.window.super_span<float,_2UL>.member.next = 2;
  local_58.member.mean = 0.0;
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push
            ((basic_moment<float,_2UL,_(trial::online::with)1> *)
             local_58.member.window.super_span<float,_2UL>.member.data,1.0);
  local_5c = local_5c & 0xffffff00;
  local_68._0_1_ = local_58.member.window.super_span<float,_2UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x143,"void mean_float_2_suite::test_one()",&local_68,&local_5c);
  local_68 = CONCAT71(local_68._1_7_,local_58.member.window.super_span<float,_2UL>.member.size == 2)
  ;
  local_5c = local_5c & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x144,"void mean_float_2_suite::test_one()",&local_68,&local_5c);
  local_68 = local_58.member.window.super_span<float,_2UL>.member.size;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x145,"void mean_float_2_suite::test_one()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x146,"void mean_float_2_suite::test_one()",&local_68,&local_5c);
  return;
}

Assistant:

void test_one()
{
    window::moment<float, 2> filter;
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
}